

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void test_ecmult_accumulate(secp256k1_sha256 *acc,secp256k1_scalar *x,secp256k1_scratch *scratch)

{
  int iVar1;
  uchar zerobyte [1];
  size_t size;
  uchar bytes [65];
  secp256k1_ge r;
  secp256k1_gej infj;
  secp256k1_gej gj;
  secp256k1_gej rj6;
  secp256k1_gej rj5;
  secp256k1_gej rj4;
  secp256k1_gej rj3;
  secp256k1_gej rj2;
  secp256k1_gej rj1;
  secp256k1_scalar *in_stack_000008e0;
  secp256k1_ge *in_stack_000008e8;
  secp256k1_gej *in_stack_000008f0;
  secp256k1_ge *in_stack_fffffffffffffa58;
  size_t *size_00;
  secp256k1_gej *in_stack_fffffffffffffa60;
  secp256k1_ge *in_stack_fffffffffffffa68;
  secp256k1_sha256 *hash;
  secp256k1_gej *in_stack_fffffffffffffab8;
  secp256k1_ge *in_stack_fffffffffffffac0;
  secp256k1_ge *in_stack_fffffffffffffae8;
  secp256k1_gej *in_stack_fffffffffffffaf0;
  void *in_stack_fffffffffffffb50;
  secp256k1_ecmult_multi_callback *in_stack_fffffffffffffb58;
  secp256k1_scalar *in_stack_fffffffffffffb60;
  secp256k1_gej *in_stack_fffffffffffffb68;
  secp256k1_scratch *in_stack_fffffffffffffb70;
  secp256k1_callback *in_stack_fffffffffffffb78;
  size_t in_stack_fffffffffffffb90;
  secp256k1_scalar *in_stack_fffffffffffffbb0;
  secp256k1_gej *in_stack_fffffffffffffbb8;
  secp256k1_ecmult_gen_context *in_stack_fffffffffffffbc0;
  
  hash = (secp256k1_sha256 *)0x41;
  secp256k1_gej_set_ge(in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
  secp256k1_gej_set_infinity((secp256k1_gej *)0x145809);
  secp256k1_ecmult_gen
            (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
  secp256k1_ecmult((secp256k1_gej *)rj4.y.n[0],(secp256k1_gej *)rj4.x._40_8_,
                   (secp256k1_scalar *)rj4.x.n[4],(secp256k1_scalar *)rj4.x.n[3]);
  secp256k1_ecmult((secp256k1_gej *)rj4.y.n[0],(secp256k1_gej *)rj4.x._40_8_,
                   (secp256k1_scalar *)rj4.x.n[4],(secp256k1_scalar *)rj4.x.n[3]);
  iVar1 = secp256k1_ecmult_multi_var
                    (in_stack_fffffffffffffb78,in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
                     in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,
                     in_stack_fffffffffffffb90);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1505,
            "test condition failed: secp256k1_ecmult_multi_var(&CTX->error_callback, scratch, &rj4, x, NULL, NULL, 0)"
           );
    abort();
  }
  size_00 = (size_t *)0x1;
  iVar1 = secp256k1_ecmult_multi_var
                    (in_stack_fffffffffffffb78,in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
                     in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,
                     in_stack_fffffffffffffb90);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1506,
            "test condition failed: secp256k1_ecmult_multi_var(&CTX->error_callback, scratch, &rj5, &secp256k1_scalar_zero, test_ecmult_accumulate_cb, (void*)x, 1)"
           );
    abort();
  }
  secp256k1_ecmult_const(in_stack_000008f0,in_stack_000008e8,in_stack_000008e0);
  secp256k1_ge_set_gej_var(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
  iVar1 = secp256k1_gej_eq_ge_var(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1509,"test condition failed: secp256k1_gej_eq_ge_var(&rj2, &r)");
    abort();
  }
  iVar1 = secp256k1_gej_eq_ge_var(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x150a,"test condition failed: secp256k1_gej_eq_ge_var(&rj3, &r)");
    abort();
  }
  iVar1 = secp256k1_gej_eq_ge_var(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x150b,"test condition failed: secp256k1_gej_eq_ge_var(&rj4, &r)");
    abort();
  }
  iVar1 = secp256k1_gej_eq_ge_var(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x150c,"test condition failed: secp256k1_gej_eq_ge_var(&rj5, &r)");
    abort();
  }
  iVar1 = secp256k1_gej_eq_ge_var(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x150d,"test condition failed: secp256k1_gej_eq_ge_var(&rj6, &r)");
    abort();
  }
  iVar1 = secp256k1_ge_is_infinity((secp256k1_ge *)0x145b84);
  if (iVar1 == 0) {
    secp256k1_eckey_pubkey_serialize
              (in_stack_fffffffffffffa68,(uchar *)in_stack_fffffffffffffa60,size_00,0);
    if (hash != (secp256k1_sha256 *)0x41) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x1515,"test condition failed: size == 65");
      abort();
    }
    secp256k1_sha256_write
              ((secp256k1_sha256 *)0x41,(uchar *)in_stack_fffffffffffffa68,
               (size_t)in_stack_fffffffffffffa60);
  }
  else {
    memset(&stack0xfffffffffffffa6f,0,1);
    secp256k1_sha256_write
              (hash,(uchar *)in_stack_fffffffffffffa68,(size_t)in_stack_fffffffffffffa60);
  }
  return;
}

Assistant:

static void test_ecmult_accumulate(secp256k1_sha256* acc, const secp256k1_scalar* x, secp256k1_scratch* scratch) {
    /* Compute x*G in 6 different ways, serialize it uncompressed, and feed it into acc. */
    secp256k1_gej rj1, rj2, rj3, rj4, rj5, rj6, gj, infj;
    secp256k1_ge r;
    unsigned char bytes[65];
    size_t size = 65;
    secp256k1_gej_set_ge(&gj, &secp256k1_ge_const_g);
    secp256k1_gej_set_infinity(&infj);
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx, &rj1, x);
    secp256k1_ecmult(&rj2, &gj, x, &secp256k1_scalar_zero);
    secp256k1_ecmult(&rj3, &infj, &secp256k1_scalar_zero, x);
    CHECK(secp256k1_ecmult_multi_var(&CTX->error_callback, scratch, &rj4, x, NULL, NULL, 0));
    CHECK(secp256k1_ecmult_multi_var(&CTX->error_callback, scratch, &rj5, &secp256k1_scalar_zero, test_ecmult_accumulate_cb, (void*)x, 1));
    secp256k1_ecmult_const(&rj6, &secp256k1_ge_const_g, x);
    secp256k1_ge_set_gej_var(&r, &rj1);
    CHECK(secp256k1_gej_eq_ge_var(&rj2, &r));
    CHECK(secp256k1_gej_eq_ge_var(&rj3, &r));
    CHECK(secp256k1_gej_eq_ge_var(&rj4, &r));
    CHECK(secp256k1_gej_eq_ge_var(&rj5, &r));
    CHECK(secp256k1_gej_eq_ge_var(&rj6, &r));
    if (secp256k1_ge_is_infinity(&r)) {
        /* Store infinity as 0x00 */
        const unsigned char zerobyte[1] = {0};
        secp256k1_sha256_write(acc, zerobyte, 1);
    } else {
        /* Store other points using their uncompressed serialization. */
        secp256k1_eckey_pubkey_serialize(&r, bytes, &size, 0);
        CHECK(size == 65);
        secp256k1_sha256_write(acc, bytes, size);
    }
}